

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QExplicitlySharedDataPointer<QRawFontPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QRawFontPrivate> *this)

{
  QAtomicInt *pQVar1;
  QRawFontPrivate *pQVar2;
  QFontEngine *pQVar3;
  QRawFontPrivate *pQVar4;
  
  pQVar4 = (QRawFontPrivate *)operator_new(0x18);
  pQVar2 = (this->d).ptr;
  pQVar3 = pQVar2->fontEngine;
  pQVar4->fontEngine = pQVar3;
  pQVar4->hintingPreference = pQVar2->hintingPreference;
  (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  pQVar4->thread = pQVar2->thread;
  if (pQVar3 != (QFontEngine *)0x0) {
    LOCK();
    (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  LOCK();
  (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar1 = &((this->d).ptr)->ref;
  (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (pQVar2 = (this->d).ptr, pQVar2 != (QRawFontPrivate *)0x0)) {
    if (pQVar2->fontEngine != (QFontEngine *)0x0) {
      LOCK();
      pQVar1 = &pQVar2->fontEngine->ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (pQVar2->fontEngine != (QFontEngine *)0x0)) {
        (*pQVar2->fontEngine->_vptr_QFontEngine[1])();
      }
      pQVar2->fontEngine = (QFontEngine *)0x0;
    }
    pQVar2->hintingPreference = PreferDefaultHinting;
    operator_delete(pQVar2,0x18);
  }
  (this->d).ptr = pQVar4;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}